

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.h
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::potential_solution::are_selectors_all_equal
          (potential_solution *this)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uchar *puVar4;
  long in_RDI;
  uint i;
  uint s;
  uint local_18;
  bool local_1;
  
  bVar2 = vector<unsigned_char>::empty((vector<unsigned_char> *)(in_RDI + 8));
  if (bVar2) {
    local_1 = false;
  }
  else {
    puVar4 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 8),0);
    uVar1 = *puVar4;
    for (local_18 = 1; uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 8)),
        local_18 < uVar3; local_18 = local_18 + 1) {
      puVar4 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 8),local_18);
      if (*puVar4 != uVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool are_selectors_all_equal() const {
      if (m_selectors.empty())
        return false;
      const uint s = m_selectors[0];
      for (uint i = 1; i < m_selectors.size(); i++)
        if (m_selectors[i] != s)
          return false;
      return true;
    }